

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

bool FIX::DoubleConvertor::convert(string *value,double *result)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  double dVar5;
  int processed_chars;
  int local_c;
  
  pcVar2 = (value->_M_dataplus)._M_p;
  if (*pcVar2 != '\0') {
    pcVar4 = pcVar2;
    if (*pcVar2 == '-') {
      if (pcVar2[1] == '\0') {
        return false;
      }
      pcVar4 = pcVar2 + 1;
    }
    if ((int)*pcVar4 - 0x30U < 10) {
      do {
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
      } while ((int)*pcVar1 - 0x30U < 10);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    if ((*pcVar4 == '.') && (pcVar1 = pcVar4 + 1, pcVar4 = pcVar4 + 1, (int)*pcVar1 - 0x30U < 10)) {
      do {
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
      } while ((int)*pcVar1 - 0x30U < 10);
      bVar3 = true;
    }
    if ((*pcVar4 == '\0') && (bVar3)) {
      dVar5 = (double)FIX::DoubleConvertor::fast_strtod
                                (pcVar2,(int)value->_M_string_length,&local_c);
      *result = dVar5;
      return true;
    }
  }
  return false;
}

Assistant:

static bool convert(const std::string &value, double &result) {
    const char *i = value.c_str();

    // Catch null strings
    if (!*i) {
      return false;
    }
    // Eat leading '-' and recheck for null string
    if (*i == '-' && !*++i) {
      return false;
    }

    bool haveDigit = false;

    if (IS_DIGIT(*i)) {
      haveDigit = true;
      while (IS_DIGIT(*++i))
        ;
    }

    if (*i == '.' && IS_DIGIT(*++i)) {
      haveDigit = true;
      while (IS_DIGIT(*++i))
        ;
    }

    if (*i || !haveDigit) {
      return false;
    }

    int processed_chars;
    const size_t total_length = value.length();
    result = fast_strtod(value.c_str(), static_cast<int>(total_length), &processed_chars);

    return true;
  }